

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_mask_table_last(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  FT_Error FVar1;
  PS_Mask local_20;
  
  if ((ulong)table->num_masks == 0) {
    FVar1 = ps_mask_table_alloc(table,memory,&local_20);
  }
  else {
    local_20 = table->masks + ((ulong)table->num_masks - 1);
    FVar1 = 0;
  }
  *amask = local_20;
  return FVar1;
}

Assistant:

static FT_Error
  ps_mask_table_last( PS_Mask_Table  table,
                      FT_Memory      memory,
                      PS_Mask       *amask )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   count;
    PS_Mask   mask;


    count = table->num_masks;
    if ( count == 0 )
    {
      error = ps_mask_table_alloc( table, memory, &mask );
      if ( error )
        goto Exit;
    }
    else
      mask = table->masks + count - 1;

  Exit:
    *amask = mask;
    return error;
  }